

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::prepareDataForTexture<unsigned_char,4u>
               (Functions *gl,GLint cube_face,GLint element_index,GLint mipmap_level,
               GLenum texture_format,GLenum texture_type,GLsizei texture_width,
               GLsizei texture_height,uchar *components)

{
  glTexSubImage3DFunc p_Var1;
  GLint GVar2;
  GLenum err;
  reference pvVar3;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  GLuint z_offset;
  GLuint n_total_componenets;
  GLuint n_pixels;
  GLenum texture_type_local;
  GLenum texture_format_local;
  GLint mipmap_level_local;
  GLint element_index_local;
  GLint cube_face_local;
  Functions *gl_local;
  
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = texture_width * texture_height * 4;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = cube_face + element_index * 6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
             (ulong)texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
  fillImage<unsigned_char,4u>(texture_width,texture_height,components,pvVar3);
  GVar2 = (int)texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  p_Var1 = gl->texSubImage3D;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
  (*p_Var1)(0x9009,mipmap_level,0,0,GVar2,texture_width,texture_height,1,texture_format,texture_type
            ,pvVar3);
  err = (*gl->getError)();
  glu::checkError(err,"Failed to update texture data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x37b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return;
}

Assistant:

void prepareDataForTexture(const glw::Functions& gl, glw::GLint cube_face, glw::GLint element_index,
						   glw::GLint mipmap_level, glw::GLenum texture_format, glw::GLenum texture_type,
						   glw::GLsizei texture_width, glw::GLsizei texture_height, const T* components)
{
	static const glw::GLuint n_components_per_pixel = N_Components;

	const glw::GLuint n_pixels			  = texture_width * texture_height;
	const glw::GLuint n_total_componenets = n_components_per_pixel * n_pixels;
	const glw::GLuint z_offset			  = element_index * 6 + cube_face;

	std::vector<T> texture_data;
	texture_data.resize(n_total_componenets);

	fillImage<T, N_Components>(texture_width, texture_height, components, &texture_data[0]);

	gl.texSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, 0 /* x */, 0 /* y */, z_offset, texture_width,
					 texture_height, 1 /* depth */, texture_format, texture_type, &texture_data[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to update texture data");
}